

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fftrun(fitsfile *fptr,LONGLONG filesize,int *status)

{
  int *status_local;
  LONGLONG filesize_local;
  fitsfile *fptr_local;
  
  if (driverTable[fptr->Fptr->driver].truncate == (_func_int_int_LONGLONG *)0x0) {
    fptr_local._4_4_ = *status;
  }
  else {
    ffflsh(fptr,0,status);
    fptr->Fptr->filesize = filesize;
    fptr->Fptr->io_pos = filesize;
    fptr->Fptr->logfilesize = filesize;
    fptr->Fptr->bytepos = filesize;
    ffbfeof(fptr,status);
    fptr_local._4_4_ = (*driverTable[fptr->Fptr->driver].truncate)(fptr->Fptr->filehandle,filesize);
    *status = fptr_local._4_4_;
  }
  return fptr_local._4_4_;
}

Assistant:

int fftrun( fitsfile *fptr,    /* I - FITS file pointer           */
             LONGLONG filesize,   /* I - size to truncate the file   */
             int *status)      /* O - error status                */
/*
  low level routine to truncate a file to a new smaller size.
*/
{
  if (driverTable[(fptr->Fptr)->driver].truncate)
  {
    ffflsh(fptr, FALSE, status);  /* flush all the buffers first */
    (fptr->Fptr)->filesize = filesize;
    (fptr->Fptr)->io_pos = filesize;
    (fptr->Fptr)->logfilesize = filesize;
    (fptr->Fptr)->bytepos = filesize;
    ffbfeof(fptr, status);   /* eliminate any buffers beyond current EOF */
    return (*status = 
     (*driverTable[(fptr->Fptr)->driver].truncate)((fptr->Fptr)->filehandle,
     filesize) );
  }
  else
    return(*status);
}